

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::logCLInfo(CLIntercept *this)

{
  cl_icd_dispatch *pcVar1;
  CLIntercept *this_00;
  CLIntercept *in_RDI;
  float __x;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  double __x_00;
  undefined8 uVar2;
  undefined8 extraout_XMM0_Qa_05;
  CLIntercept *unaff_retaddr;
  cl_uint d;
  cl_device_id *devices;
  cl_uint numDevices;
  cl_uint p;
  cl_platform_id *platforms;
  cl_uint numPlatforms;
  cl_int errorCode;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff18;
  lock_guard<std::mutex> *in_stack_ffffffffffffff20;
  allocator local_69;
  string local_68 [36];
  uint local_44;
  cl_device_id *local_40;
  uint in_stack_ffffffffffffffc8;
  uint uVar3;
  cl_uint local_18;
  cl_int local_14;
  CLIntercept *device;
  
  if ((in_RDI->m_LoggedCLInfo & 1U) == 0) {
    device = in_RDI;
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if ((in_RDI->m_LoggedCLInfo & 1U) == 0) {
      in_RDI->m_LoggedCLInfo = true;
      local_14 = 0;
      local_18 = 0;
      pcVar1 = dispatch(in_RDI);
      local_14 = (*pcVar1->clGetPlatformIDs)(0,(cl_platform_id *)0x0,&local_18);
      if ((local_14 == 0) && (local_18 != 0)) {
        logf(in_RDI,__x);
        this_00 = (CLIntercept *)operator_new__((ulong)local_18 << 3);
        if (this_00 == (CLIntercept *)0x0) {
          local_14 = -6;
          uVar2 = extraout_XMM0_Qa;
        }
        else {
          pcVar1 = dispatch(in_RDI);
          local_14 = (*pcVar1->clGetPlatformIDs)(local_18,(cl_platform_id *)this_00,(cl_uint *)0x0);
          uVar2 = extraout_XMM0_Qa_00;
        }
        for (uVar3 = 0; uVar3 < local_18; uVar3 = uVar3 + 1) {
          if (local_14 == 0) {
            logf(in_RDI,(float)uVar2);
            logPlatformInfo(this_00,(cl_platform_id)CONCAT44(uVar3,in_stack_ffffffffffffffc8));
            uVar2 = extraout_XMM0_Qa_01;
          }
          in_stack_ffffffffffffffc8 = 0;
          if (local_14 == 0) {
            pcVar1 = dispatch(in_RDI);
            local_14 = (*pcVar1->clGetDeviceIDs)
                                 ((cl_platform_id)(&this_00->m_ProcessId)[uVar3],0xffffffff,0,
                                  (cl_device_id *)0x0,(cl_uint *)&stack0xffffffffffffffc8);
            uVar2 = extraout_XMM0_Qa_02;
          }
          if ((local_14 == 0) && (in_stack_ffffffffffffffc8 != 0)) {
            logf(in_RDI,(float)uVar2);
            local_40 = (cl_device_id *)operator_new__((ulong)in_stack_ffffffffffffffc8 << 3);
            if (local_40 == (cl_device_id *)0x0) {
              local_14 = -6;
              uVar2 = extraout_XMM0_Qa_03;
            }
            else {
              pcVar1 = dispatch(in_RDI);
              local_14 = (*pcVar1->clGetDeviceIDs)
                                   ((cl_platform_id)(&this_00->m_ProcessId)[uVar3],0xffffffff,
                                    in_stack_ffffffffffffffc8,local_40,(cl_uint *)0x0);
              uVar2 = extraout_XMM0_Qa_04;
            }
            for (local_44 = 0; local_44 < in_stack_ffffffffffffffc8; local_44 = local_44 + 1) {
              if (local_14 == 0) {
                logf(in_RDI,(float)uVar2);
                logDeviceInfo(unaff_retaddr,(cl_device_id)device);
                std::allocator<char>::allocator();
                __x_00 = (double)std::__cxx11::string::string(local_68,"\n",&local_69);
                log(in_RDI,__x_00);
                std::__cxx11::string::~string(local_68);
                uVar2 = std::allocator<char>::~allocator((allocator<char> *)&local_69);
              }
            }
            if (local_40 != (cl_device_id *)0x0) {
              operator_delete__(local_40);
              uVar2 = extraout_XMM0_Qa_05;
            }
          }
        }
        if (this_00 != (CLIntercept *)0x0) {
          operator_delete__(this_00);
        }
      }
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f373b);
  }
  return;
}

Assistant:

void CLIntercept::logCLInfo()
{
    if( m_LoggedCLInfo == false )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        if( m_LoggedCLInfo == false )
        {
            m_LoggedCLInfo = true;

            cl_int  errorCode = CL_SUCCESS;
            cl_uint numPlatforms = 0;

            if( errorCode == CL_SUCCESS )
            {
                errorCode = dispatch().clGetPlatformIDs(
                    0,
                    NULL,
                    &numPlatforms );
            }

            if( errorCode == CL_SUCCESS && numPlatforms != 0 )
            {
                logf( "\nEnumerated %u platform%s.\n\n",
                    numPlatforms,
                    numPlatforms > 1 ? "s" : "" );

                cl_platform_id* platforms = new cl_platform_id[numPlatforms];
                if( platforms )
                {
                    errorCode = dispatch().clGetPlatformIDs(
                        numPlatforms,
                        platforms,
                        NULL );
                }
                else
                {
                    errorCode = CL_OUT_OF_HOST_MEMORY;
                }

                for( cl_uint p = 0; p < numPlatforms; p++ )
                {
                    if( errorCode == CL_SUCCESS )
                    {
                        logf( "Platform %u:\n", p );
                        logPlatformInfo( platforms[p] );
                    }

                    cl_uint numDevices = 0;

                    if( errorCode == CL_SUCCESS )
                    {
                        errorCode = dispatch().clGetDeviceIDs(
                            platforms[p],
                            CL_DEVICE_TYPE_ALL,
                            0,
                            NULL,
                            &numDevices );
                    }
                    if( errorCode == CL_SUCCESS && numDevices != 0 )
                    {
                        logf( "\tPlatform has %u device%s.\n\n",
                            numDevices,
                            numDevices > 1 ? "s" : "" );

                        cl_device_id*   devices = new cl_device_id[numDevices];
                        if( devices )
                        {
                            errorCode = dispatch().clGetDeviceIDs(
                                platforms[p],
                                CL_DEVICE_TYPE_ALL,
                                numDevices,
                                devices,
                                NULL );
                        }
                        else
                        {
                            errorCode = CL_OUT_OF_HOST_MEMORY;
                        }

                        for( cl_uint d = 0; d < numDevices; d++ )
                        {
                            if( errorCode == CL_SUCCESS )
                            {
                                logf( "Device %u:\n", d );
                                logDeviceInfo( devices[d] );
                                log( "\n" );
                            }
                        }

                        delete [] devices;
                    }
                }

                delete [] platforms;
            }
        }
    }
}